

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,SymbolVisibility *visibility)

{
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  _anonymous_namespace_ *local_18;
  SymbolVisibility *visibility_local;
  
  local_18 = this;
  visibility_local = (SymbolVisibility *)__return_storage_ptr__;
  if (*(int *)this == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"local ",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else if (*(int *)this == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"export ",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VisibilityToKeyword(const SymbolVisibility& visibility) {
  switch (visibility) {
    case SymbolVisibility::VISIBILITY_EXPORT:
      return "export ";
      break;
    case SymbolVisibility::VISIBILITY_LOCAL:
      return "local ";
      break;
    default:
      break;
  }
  return "";
}